

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O1

void __thiscall
AbstractTransaction_GetValueOut_Test::~AbstractTransaction_GetValueOut_Test
          (AbstractTransaction_GetValueOut_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AbstractTransaction, GetValueOut) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));
  tx.AddTxOut(Amount::CreateBySatoshiAmount(10000),
              Script("0014913e0b9281dab16f502101ad4e655074396f34c5"));
  Amount amount;
  // GetValueOut
  EXPECT_NO_THROW(amount = tx.GetValueOut());
  EXPECT_EQ(amount.GetSatoshiValue(), 10000);

  // GetHash(bool)
  ByteData256 bytedata;
  EXPECT_NO_THROW(bytedata = tx.GetHash());
  EXPECT_STREQ(
      bytedata.GetHex().c_str(),
      "94807f961466e1e236d8192f9a073fb9dea46cad8434c568b55dec0a0f197b0f");

  // GetWitnessHash
  ByteData bytedata2(
      "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  EXPECT_NO_THROW(tx.AddScriptWitnessStack(0, bytedata2));
  EXPECT_NO_THROW(bytedata = tx.GetWitnessHash());
  EXPECT_STREQ(
      bytedata.GetHex().c_str(),
      "0cc445f41d8b7af9d9f24b60516b1f4ce18d67595b1ca9143678a8df2a7b7416");

  // GetHex
  std::string hex;
  EXPECT_NO_THROW(hex = tx.GetHex());
  EXPECT_STREQ(
      hex.c_str(),
      "02000000000101b690010c9f7fea1c2ec617a8513dec56a8bd294e2fb671f67af487671f1ef7e9000000001976a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88acffffffff011027000000000000160014913e0b9281dab16f502101ad4e655074396f34c5012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d8278076303000000");

  // GetTxid
  Txid txid;
  EXPECT_NO_THROW(txid = tx.GetTxid());
  EXPECT_STREQ(
      txid.GetHex().c_str(),
      "0f7b190f0aec5db568c53484ad6ca4deb93f079a2f19d836e2e16614967f8094");
}